

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O1

void __thiscall
MidiPlayerDialog::handlePlaybackTimeChanged
          (MidiPlayerDialog *this,quint64 currentNanos,quint32 totalSeconds)

{
  char cVar1;
  ulong uVar2;
  QByteArrayView QVar3;
  QString pos;
  QArrayData *local_b8 [3];
  QArrayData *local_a0 [3];
  QArrayData *local_88 [3];
  QArrayData *local_70 [3];
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QArrayData *local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  QVar3.m_data = (storage_type *)0xd;
  QVar3.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar3);
  local_58 = local_40;
  uStack_50 = uStack_38;
  local_48 = local_30;
  uVar2 = currentNanos / 1000000000 & 0xffffffff;
  QString::arg((ulonglong)local_b8,(int)&local_58,(int)(uVar2 / 0x3c),(QChar)0x2);
  QString::arg((ulonglong)local_a0,(int)local_b8,
               (int)(currentNanos / 1000000000) + (int)(uVar2 / 0x3c) * -0x3c,(QChar)0x2);
  QString::arg((ulonglong)local_88,(int)local_a0,totalSeconds / 0x3c,(QChar)0x2);
  QString::arg((ulonglong)local_70,(int)local_88,totalSeconds % 0x3c,(QChar)0x2);
  if (local_88[0] != (QArrayData *)0x0) {
    LOCK();
    (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88[0],2,8);
    }
  }
  if (local_a0[0] != (QArrayData *)0x0) {
    LOCK();
    (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0[0],2,8);
    }
  }
  if (local_b8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8[0],2,8);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  QLabel::setText(*(QString **)(this->ui + 0x68));
  cVar1 = QAbstractSlider::isSliderDown();
  if (cVar1 == '\0') {
    this->sliderUpdating = true;
    QAbstractSlider::setSliderPosition((int)*(undefined8 *)(this->ui + 0x70));
    this->sliderUpdating = false;
  }
  if (local_70[0] != (QArrayData *)0x0) {
    LOCK();
    (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70[0],2,8);
    }
  }
  return;
}

Assistant:

void MidiPlayerDialog::handlePlaybackTimeChanged(quint64 currentNanos, quint32 totalSeconds) {
	quint32 currentSeconds = currentNanos / MasterClock::NANOS_PER_SECOND;
	QChar z = QChar('0');
	QString pos = QString("%1:%2 / %3:%4").arg(currentSeconds / 60, 2, 10, z).arg(currentSeconds % 60, 2, 10, z).arg(totalSeconds / 60, 2, 10, z).arg(totalSeconds % 60, 2, 10, z);
	ui->positionLabel->setText(pos);
	if (!ui->positionSlider->isSliderDown()) {
		sliderUpdating = true;
		ui->positionSlider->setSliderPosition((totalSeconds != 0) ? currentNanos / MasterClock::NANOS_PER_MILLISECOND / totalSeconds : 0);
		sliderUpdating = false;
	}
}